

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp.c
# Opt level: O0

_Bool uo_tcp_init(void)

{
  _Bool _Var1;
  undefined1 local_9;
  
  if (is_init) {
    local_9 = is_init;
  }
  else {
    is_init = true;
    _Var1 = uo_cb_init();
    is_init = (is_init & 1U & _Var1) != 0;
    _Var1 = uo_sock_init();
    is_init = (is_init & 1U & _Var1) != 0;
    _Var1 = uo_io_init();
    local_9 = (is_init & 1U & _Var1) != 0;
  }
  is_init = (_Bool)local_9;
  return (_Bool)local_9;
}

Assistant:

bool uo_tcp_init(void)
{
    if (is_init)
        return is_init;

    is_init = true;

    is_init &= uo_cb_init();
    is_init &= uo_sock_init();
    is_init &= uo_io_init();

    return is_init;
}